

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O3

void * duckdb_je_bootstrap_calloc(size_t num,size_t size)

{
  void *pvVar1;
  size_t size_00;
  
  size_00 = num * size;
  if (size_00 == 0) {
    size_00 = 1;
  }
  pvVar1 = a0ialloc(size_00,true,false);
  return pvVar1;
}

Assistant:

void *
bootstrap_calloc(size_t num, size_t size) {
	size_t num_size;

	num_size = num * size;
	if (unlikely(num_size == 0)) {
		assert(num == 0 || size == 0);
		num_size = 1;
	}

	return a0ialloc(num_size, true, false);
}